

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetPropCommandBase.cxx
# Opt level: O1

bool __thiscall
cmTargetPropCommandBase::ProcessContentArgs
          (cmTargetPropCommandBase *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,uint *argIndex,bool prepend,bool system)

{
  uint uVar1;
  pointer pbVar2;
  bool bVar3;
  byte bVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  cmTargetPropCommandBase *this_00;
  ulong uVar8;
  string *scope;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  content;
  string local_58;
  cmTargetPropCommandBase *local_38;
  
  scope = (args->
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )._M_impl.super__Vector_impl_data._M_start + *argIndex;
  iVar5 = std::__cxx11::string::compare((char *)scope);
  if (iVar5 == 0) {
LAB_00373c5a:
    if (this->Target->IsImportedTarget != true) {
      if (this->Target->TargetTypeValue == INTERFACE_LIBRARY) {
        iVar5 = std::__cxx11::string::compare((char *)scope);
        if (iVar5 != 0) {
          local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_58,"may only be set INTERFACE properties on INTERFACE targets"
                     ,"");
          cmCommand::SetError(&this->super_cmCommand,&local_58);
          goto LAB_00373cc0;
        }
      }
      uVar7 = *argIndex;
      uVar1 = uVar7 + 1;
      uVar8 = (ulong)uVar1;
      *argIndex = uVar1;
      local_58._M_dataplus._M_p = (pointer)0x0;
      local_58._M_string_length = 0;
      local_58.field_2._M_allocated_capacity = 0;
      pbVar2 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
      bVar3 = uVar8 < uVar6;
      local_38 = this;
      if (uVar8 < uVar6) {
        iVar5 = std::__cxx11::string::compare((char *)(pbVar2 + uVar8));
        if (iVar5 != 0) {
          uVar7 = uVar7 + 2;
          do {
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar8));
            if (iVar5 == 0) break;
            iVar5 = std::__cxx11::string::compare
                              ((char *)((args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_start + uVar8));
            if (iVar5 == 0) break;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&local_58,
                        (args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + uVar8);
            *argIndex = *argIndex + 1;
            uVar8 = (ulong)uVar7;
            pbVar2 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar6 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2 >> 5;
            bVar3 = uVar8 < uVar6;
            if (uVar6 <= uVar8) goto LAB_00373de8;
            iVar5 = std::__cxx11::string::compare((char *)(pbVar2 + uVar8));
            uVar7 = uVar7 + 1;
          } while (iVar5 != 0);
        }
        this_00 = local_38;
        bVar4 = PopulateTargetProperies
                          (local_38,scope,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_58,prepend,system);
      }
      else {
LAB_00373de8:
        bVar4 = (byte)uVar8;
        this_00 = local_38;
      }
      if (!bVar3) {
        bVar4 = PopulateTargetProperies
                          (this_00,scope,
                           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&local_58,prepend,system);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_58);
      goto LAB_00373e1a;
    }
    (*(this->super_cmCommand)._vptr_cmCommand[8])
              (this,(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start);
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)scope);
    if (iVar5 == 0) goto LAB_00373c5a;
    iVar5 = std::__cxx11::string::compare((char *)scope);
    if (iVar5 == 0) goto LAB_00373c5a;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"called with invalid arguments","");
    cmCommand::SetError(&this->super_cmCommand,&local_58);
LAB_00373cc0:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  bVar4 = 0;
LAB_00373e1a:
  return (bool)(bVar4 & 1);
}

Assistant:

bool cmTargetPropCommandBase::ProcessContentArgs(
  std::vector<std::string> const& args, unsigned int& argIndex, bool prepend,
  bool system)
{
  std::string const& scope = args[argIndex];

  if (scope != "PUBLIC" && scope != "PRIVATE" && scope != "INTERFACE") {
    this->SetError("called with invalid arguments");
    return false;
  }

  if (this->Target->IsImported()) {
    this->HandleImportedTarget(args[0]);
    return false;
  }

  if (this->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY &&
      scope != "INTERFACE") {
    this->SetError("may only be set INTERFACE properties on INTERFACE "
                   "targets");
    return false;
  }

  ++argIndex;

  std::vector<std::string> content;

  for (unsigned int i = argIndex; i < args.size(); ++i, ++argIndex) {
    if (args[i] == "PUBLIC" || args[i] == "PRIVATE" ||
        args[i] == "INTERFACE") {
      return this->PopulateTargetProperies(scope, content, prepend, system);
    }
    content.push_back(args[i]);
  }
  return this->PopulateTargetProperies(scope, content, prepend, system);
}